

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              secp256k1_sha256 *s2c_sha,secp256k1_ecdsa_s2c_opening *s2c_opening,uchar *s2c_data32,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  uint uVar1;
  int iVar2;
  int local_1ac;
  undefined1 local_1a8 [4];
  int zero;
  secp256k1_ge nonce_p;
  secp256k1_gej nonce_pj;
  int is_nonce_valid;
  uint count;
  uchar nonce32 [32];
  uint local_9c;
  int is_sec_valid;
  int ret;
  secp256k1_scalar msg;
  secp256k1_scalar non;
  secp256k1_scalar sec;
  secp256k1_ecdsa_s2c_opening *s2c_opening_local;
  secp256k1_sha256 *s2c_sha_local;
  int *recid_local;
  secp256k1_scalar *s_local;
  secp256k1_scalar *r_local;
  secp256k1_context *ctx_local;
  
  local_9c = 0;
  nonce_pj._124_4_ = 0;
  r->d[0] = 0;
  r->d[1] = 0;
  r->d[2] = 0;
  r->d[3] = 0;
  s->d[0] = 0;
  s->d[1] = 0;
  s->d[2] = 0;
  s->d[3] = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  if (noncefp == (secp256k1_nonce_function)0x0) {
    noncefp = nonce_function_rfc6979;
  }
  uVar1 = secp256k1_scalar_set_b32_seckey((secp256k1_scalar *)(non.d + 3),seckey);
  secp256k1_scalar_cmov
            ((secp256k1_scalar *)(non.d + 3),&secp256k1_scalar_one,(uint)((uVar1 != 0 ^ 0xffU) & 1))
  ;
  secp256k1_scalar_set_b32((secp256k1_scalar *)&is_sec_valid,msg32,(int *)0x0);
  while( true ) {
    iVar2 = (*noncefp)((uchar *)&is_nonce_valid,msg32,seckey,(uchar *)0x0,noncedata,nonce_pj._124_4_
                      );
    local_9c = (uint)(iVar2 != 0);
    if (local_9c == 0) break;
    nonce_pj.infinity =
         secp256k1_scalar_set_b32_seckey((secp256k1_scalar *)(msg.d + 3),(uchar *)&is_nonce_valid);
    secp256k1_declassify(ctx,&nonce_pj.infinity,4);
    if (nonce_pj.infinity != 0) {
      if (s2c_data32 != (uchar *)0x0) {
        secp256k1_ecmult_gen
                  (&ctx->ecmult_gen_ctx,(secp256k1_gej *)&nonce_p.infinity,
                   (secp256k1_scalar *)(msg.d + 3));
        secp256k1_ge_set_gej((secp256k1_ge *)local_1a8,(secp256k1_gej *)&nonce_p.infinity);
        if (s2c_opening != (secp256k1_ecdsa_s2c_opening *)0x0) {
          secp256k1_ecdsa_s2c_opening_save(s2c_opening,(secp256k1_ge *)local_1a8);
        }
        secp256k1_declassify(ctx,nonce_p.y.n + 4,4);
        local_9c = secp256k1_ec_commit_seckey
                             ((secp256k1_scalar *)(msg.d + 3),(secp256k1_ge *)local_1a8,s2c_sha,
                              s2c_data32,0x20);
        secp256k1_declassify(ctx,&local_9c,4);
        if (local_9c == 0) goto LAB_0011f6c0;
      }
      local_9c = secp256k1_ecdsa_sig_sign
                           (&ctx->ecmult_gen_ctx,r,s,(secp256k1_scalar *)(non.d + 3),
                            (secp256k1_scalar *)&is_sec_valid,(secp256k1_scalar *)(msg.d + 3),recid)
      ;
      secp256k1_declassify(ctx,&local_9c,4);
      if (local_9c != 0) goto LAB_0011f6c0;
    }
    nonce_pj._124_4_ = nonce_pj._124_4_ + 1;
  }
  local_9c = 0;
LAB_0011f6c0:
  local_9c = uVar1 & local_9c;
  memset(&is_nonce_valid,0,0x20);
  secp256k1_scalar_clear((secp256k1_scalar *)&is_sec_valid);
  secp256k1_scalar_clear((secp256k1_scalar *)(msg.d + 3));
  secp256k1_scalar_clear((secp256k1_scalar *)(non.d + 3));
  secp256k1_scalar_cmov(r,&secp256k1_scalar_zero,(uint)((local_9c != 0 ^ 0xffU) & 1));
  secp256k1_scalar_cmov(s,&secp256k1_scalar_zero,(uint)((local_9c != 0 ^ 0xffU) & 1));
  if (recid != (int *)0x0) {
    local_1ac = 0;
    secp256k1_int_cmov(recid,&local_1ac,(uint)((local_9c != 0 ^ 0xffU) & 1));
  }
  return local_9c;
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, secp256k1_sha256* s2c_sha, secp256k1_ecdsa_s2c_opening *s2c_opening, const unsigned char* s2c_data32, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }
    /* sign-to-contract commitments only work with the default nonce function,
     * because we need to ensure that s2c_data is actually hashed into the nonce and
     * not just ignored. Otherwise an attacker can exfiltrate the secret key by
     * signing the same message thrice with different commitments. */
    VERIFY_CHECK(s2c_data32 == NULL || noncefp == secp256k1_nonce_function_default);

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            if (s2c_data32 != NULL) {
                secp256k1_gej nonce_pj;
                secp256k1_ge nonce_p;

                /* Compute original nonce commitment/pubkey */
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &nonce_pj, &non);
                secp256k1_ge_set_gej(&nonce_p, &nonce_pj);
                if (s2c_opening != NULL) {
                    secp256k1_ecdsa_s2c_opening_save(s2c_opening, &nonce_p);
                }

                /* Because the nonce is valid, the nonce point isn't the point
                 * at infinity and we can declassify that information to be able to
                 * serialize the point. */
                secp256k1_declassify(ctx, &nonce_p.infinity, sizeof(nonce_p.infinity));

                /* Tweak nonce with s2c commitment. */
                ret = secp256k1_ec_commit_seckey(&non, &nonce_p, s2c_sha, s2c_data32, 32);
                secp256k1_declassify(ctx, &ret, sizeof(ret)); /* may be secret that the tweak falied, but happens with negligible probability */
                if (!ret) {
                    break;
                }
            }

            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    memset(nonce32, 0, 32);
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}